

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O0

void cppwinrt::write_class_requires(writer *w,TypeDef *type)

{
  bool bVar1;
  bool bVar2;
  TypeDef *in_RCX;
  void *__buf;
  string_view sVar3;
  basic_string_view<char,_std::char_traits<char>_> local_a8 [2];
  basic_string_view<char,_std::char_traits<char>_> local_88;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  type *local_68;
  type *info;
  type *interface_name;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>_>
  local_50;
  iterator __end1;
  iterator __begin1;
  get_interfaces_t *__range1;
  bool first;
  TypeDef *type_local;
  writer *w_local;
  
  bVar1 = true;
  get_interfaces_abi_cxx11_((get_interfaces_t *)&__begin1,(cppwinrt *)w,(writer *)type,in_RCX);
  __end1 = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
           ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                    *)&__begin1);
  local_50._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>
        *)std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
          ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                 *)&__begin1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&__end1,&local_50);
    if (!bVar2) break;
    interface_name =
         &__gnu_cxx::
          __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>_>
          ::operator*(&__end1)->first;
    info = (type *)::std::get<0ul,std::__cxx11::string,cppwinrt::interface_info>
                             ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>
                               *)interface_name);
    local_68 = ::std::get<1ul,std::__cxx11::string,cppwinrt::interface_info>
                         ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>
                           *)interface_name);
    if (((local_68->defaulted & 1U) == 0) || ((local_68->base & 1U) != 0)) {
      if (bVar1) {
        bVar1 = false;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_78,",\n        impl::require<%");
        sVar3 = winmd::reader::TypeDef::TypeName(type);
        local_88._M_str = sVar3._M_str;
        in_RCX = (TypeDef *)sVar3._M_len;
        local_88._M_len = (size_t)in_RCX;
        writer_base<cppwinrt::writer>::write<std::basic_string_view<char,std::char_traits<char>>>
                  (&w->super_writer_base<cppwinrt::writer>,&local_78,&local_88);
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_a8,", %");
      writer_base<cppwinrt::writer>::write<std::__cxx11::string>
                (&w->super_writer_base<cppwinrt::writer>,local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)info);
    }
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
             *)&__begin1);
  if (!bVar1) {
    writer_base<cppwinrt::writer>::write
              (&w->super_writer_base<cppwinrt::writer>,0x3e,__buf,(size_t)in_RCX);
  }
  return;
}

Assistant:

static void write_class_requires(writer& w, TypeDef const& type)
    {
        bool first = true;

        for (auto&& [interface_name, info] : get_interfaces(w, type))
        {
            if (!info.defaulted || info.base)
            {
                if (first)
                {
                    first = false;
                    w.write(",\n        impl::require<%", type.TypeName());
                }

                w.write(", %", interface_name);
            }
        }

        if (!first)
        {
            w.write('>');
        }
    }